

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *
kratos::extract_debug_break_points
          (vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>
           *__return_storage_ptr__,Generator *top)

{
  undefined1 local_80 [8];
  ExtractDebugVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_80 = (undefined1  [8])&PTR_visit_root_002bcc48;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  visitor.stmts_.super__Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  visitor.stmts_.super__Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  IRVisitor::visit_root((IRVisitor *)local_80,&top->super_IRNode);
  std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::vector
            (__return_storage_ptr__,
             (vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)
             &visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  local_80 = (undefined1  [8])&PTR_visit_root_002bcc48;
  if (visitor.super_IRVisitor.visited_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(visitor.super_IRVisitor.visited_._M_h._M_single_bucket,
                    (long)visitor.stmts_.
                          super__Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  }
  local_80 = (undefined1  [8])&PTR_visit_root_002bb3b0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Stmt *> extract_debug_break_points(Generator *top) {
    ExtractDebugVisitor visitor;
    visitor.visit_root(top);
    return visitor.stmts();
}